

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

re_state_id re_alloc_state(re_context *ctx)

{
  int iVar1;
  int iVar2;
  re_tuple *__dest;
  
  iVar2 = ctx->next_state;
  iVar1 = ctx->tuples_alloc;
  if (iVar2 < iVar1) {
    __dest = ctx->tuple_arr;
  }
  else {
    if (iVar1 == 0) {
      __dest = (re_tuple *)mchalo(ctx->errctx,0xc80,"regex");
      ctx->tuple_arr = __dest;
    }
    else {
      __dest = (re_tuple *)mchalo(ctx->errctx,(ulong)(iVar1 + 100U) << 5,"regex");
      memcpy(__dest,ctx->tuple_arr,(long)ctx->tuples_alloc << 5);
      free(ctx->tuple_arr);
      ctx->tuple_arr = __dest;
    }
    ctx->tuples_alloc = iVar1 + 100U;
    iVar2 = ctx->next_state;
  }
  __dest[iVar2].next_state_1 = -1;
  ctx->tuple_arr[ctx->next_state].next_state_2 = -1;
  ctx->tuple_arr[ctx->next_state].ch = '\x01';
  ctx->tuple_arr[ctx->next_state].flags = '\0';
  ctx->tuple_arr[ctx->next_state].char_range = (uchar *)0x0;
  iVar2 = ctx->next_state;
  ctx->next_state = iVar2 + 1;
  return iVar2;
}

Assistant:

static re_state_id re_alloc_state(re_context *ctx)
{
    /*
     *   If we don't have enough room for another state, expand the array 
     */
    if (ctx->next_state >= ctx->tuples_alloc)
    {
        uint new_alloc;
        
        /* bump the size by a bit */
        new_alloc = ctx->tuples_alloc + 100;
        
        /* allocate or expand the array */
        if (ctx->tuples_alloc == 0)
        {
            /* allocate the initial memory block */
            ctx->tuple_arr =
                (re_tuple *)mchalo(ctx->errctx,
                                   (new_alloc * sizeof(re_tuple)),
                                   "regex");
        }
        else
        {
            re_tuple *ptr;
            
            /* allocate a new memory block */
            ptr = (re_tuple *)mchalo(ctx->errctx,
                                     (new_alloc * sizeof(re_tuple)),
                                     "regex");
            
            /* copy the old memory to the new memory */
            memcpy(ptr, ctx->tuple_arr, ctx->tuples_alloc * sizeof(re_tuple));

            /* free the old block */
            mchfre(ctx->tuple_arr);

            /* use the new block */
            ctx->tuple_arr = ptr;
        }

        /* remember the new allocation size */
        ctx->tuples_alloc = new_alloc;
    }

    /* initialize the next state */
    ctx->tuple_arr[ctx->next_state].next_state_1 = RE_STATE_INVALID;
    ctx->tuple_arr[ctx->next_state].next_state_2 = RE_STATE_INVALID;
    ctx->tuple_arr[ctx->next_state].ch = RE_EPSILON;
    ctx->tuple_arr[ctx->next_state].flags = 0;
    ctx->tuple_arr[ctx->next_state].char_range = 0;

    /* return the new state's ID */
    return ctx->next_state++;
}